

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::PyiGenerator::ModuleLevelName<google::protobuf::EnumDescriptor>
          (string *__return_storage_ptr__,PyiGenerator *this,EnumDescriptor *descriptor)

{
  string_view pc;
  bool bVar1;
  FileDescriptor *pFVar2;
  ctrl_t *pcVar3;
  reference pvVar4;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_>_>
  pbVar5;
  AlphaNum *b;
  char in_R8B;
  undefined7 in_register_00000081;
  iterator iVar6;
  string_view filename_00;
  ConvertibleToStringView text;
  AlphaNum local_248;
  AlphaNum local_218;
  AlphaNum local_1e8;
  string local_1b8;
  size_t local_198;
  char *pcStack_190;
  AlphaNum local_188;
  AlphaNum local_158;
  string local_128;
  ConvertibleToStringView local_108;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_f8;
  undefined1 local_e0 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  tokens;
  char *local_c0;
  undefined1 local_b8 [8];
  string module_name;
  iterator local_78;
  undefined1 local_68 [8];
  string_view filename;
  string module_alias;
  EnumDescriptor *descriptor_local;
  PyiGenerator *this_local;
  string *name;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&module_alias.field_2 + 8),
             ".");
  NamePrefixedWithNestedTypes<google::protobuf::EnumDescriptor>
            (__return_storage_ptr__,descriptor,stack0xffffffffffffffc8);
  pFVar2 = EnumDescriptor::file(descriptor);
  if (pFVar2 != this->file_) {
    std::__cxx11::string::string((string *)&filename._M_str);
    pFVar2 = EnumDescriptor::file(descriptor);
    _local_68 = FileDescriptor::name(pFVar2);
    local_78 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               ::find<std::basic_string_view<char,std::char_traits<char>>>
                         ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                           *)&this->import_map_,(key_arg<std::basic_string_view<char>_> *)local_68);
    iVar6 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&this->import_map_);
    pcVar3 = iVar6.ctrl_;
    module_name.field_2._8_8_ = pcVar3;
    bVar1 = absl::lts_20250127::container_internal::operator==
                      (&local_78,(iterator *)((long)&module_name.field_2 + 8));
    if (bVar1) {
      pFVar2 = EnumDescriptor::file(descriptor);
      join_0x00000010_0x00000000_ = FileDescriptor::name(pFVar2);
      filename_00._M_str = pcVar3;
      filename_00._M_len = (size_t)local_c0;
      ModuleName_abi_cxx11_
                ((string *)local_b8,
                 (python *)
                 tokens.
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,filename_00);
      absl::lts_20250127::strings_internal::ConvertibleToStringView::ConvertibleToStringView
                (&local_108,(string *)local_b8);
      text.value_._M_str = (char *)0x2e;
      text.value_._M_len = (size_t)local_108.value_._M_str;
      b = (AlphaNum *)0x2e;
      absl::lts_20250127::StrSplit<char>
                (&local_f8,(lts_20250127 *)local_108.value_._M_len,text,in_R8B);
      absl::lts_20250127::strings_internal::
      Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
      ::
      operator_vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_nullptr>
                ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)local_e0,&local_f8);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_158,"_");
      pvVar4 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::back((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)local_e0);
      local_198 = pvVar4->_M_len;
      pcStack_190 = pvVar4->_M_str;
      pc._M_len = pvVar4->_M_len;
      pc._M_str = pvVar4->_M_str;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_188,pc);
      absl::lts_20250127::StrCat_abi_cxx11_(&local_128,(lts_20250127 *)&local_158,&local_188,b);
      std::__cxx11::string::operator=((string *)&filename._M_str,(string *)&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)local_e0);
      std::__cxx11::string::~string((string *)local_b8);
    }
    else {
      pbVar5 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
               ::
               at<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>>
                         ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                           *)&this->import_map_,(key_arg<std::basic_string_view<char>_> *)local_68);
      std::__cxx11::string::operator=((string *)&filename._M_str,(string *)pbVar5);
    }
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_1e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filename._M_str
              );
    absl::lts_20250127::AlphaNum::AlphaNum(&local_218,".");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_248,__return_storage_ptr__);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_1b8,(lts_20250127 *)&local_1e8,&local_218,&local_248,
               (AlphaNum *)CONCAT71(in_register_00000081,in_R8B));
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&filename._M_str);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PyiGenerator::ModuleLevelName(const DescriptorT& descriptor) const {
  std::string name = NamePrefixedWithNestedTypes(descriptor, ".");
  if (descriptor.file() != file_) {
    std::string module_alias;
    const absl::string_view filename = descriptor.file()->name();
    if (import_map_.find(filename) == import_map_.end()) {
      std::string module_name = ModuleName(descriptor.file()->name());
      std::vector<absl::string_view> tokens = absl::StrSplit(module_name, '.');
      module_alias = absl::StrCat("_", tokens.back());
    } else {
      module_alias = import_map_.at(filename);
    }
    name = absl::StrCat(module_alias, ".", name);
  }
  return name;
}